

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

void crnlib::utils::copy_dwords(uint32 *pDst,uint32 *pSrc,uint num,bool endian_switch)

{
  uint uVar1;
  uint32 *pDst_end;
  bool endian_switch_local;
  uint32 *puStack_20;
  uint num_local;
  uint32 *pSrc_local;
  uint32 *pDst_local;
  
  if (endian_switch) {
    puStack_20 = pSrc;
    pSrc_local = pDst;
    while (pSrc_local != pDst + num) {
      uVar1 = *puStack_20;
      *pSrc_local = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puStack_20 = puStack_20 + 1;
      pSrc_local = pSrc_local + 1;
    }
  }
  else {
    memcpy(pDst,pSrc,(ulong)(num << 2));
  }
  return;
}

Assistant:

void copy_dwords(uint32* pDst, const uint32* pSrc, uint num, bool endian_switch)
        {
            if (!endian_switch)
            {
                memcpy(pDst, pSrc, num << 2U);
            }
            else
            {
                uint32* pDst_end = pDst + num;
                while (pDst != pDst_end)
                {
                    *pDst++ = swap32(*pSrc++);
                }
            }
        }